

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_NtkPrintMiter(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void *pvVar2;
  Abc_Obj_t *pAVar3;
  abctime aVar4;
  Abc_Obj_t *pAVar5;
  abctime aVar6;
  char *pcVar7;
  int i;
  uint i_00;
  uint uVar8;
  uint i_01;
  uint uVar9;
  uint local_40;
  uint local_3c;
  
  pAVar3 = Abc_AigConst1(pNtk);
  aVar4 = Abc_Clock();
  uVar8 = 0;
  for (i = 0; i < pNtk->vPis->nSize; i = i + 1) {
    pAVar5 = Abc_NtkPi(pNtk,i);
    uVar8 = uVar8 + (0 < (pAVar5->vFanouts).nSize);
  }
  i_00 = 0xffffffff;
  uVar9 = 0;
  local_40 = 0;
  local_3c = 0;
  for (i_01 = 0; (int)i_01 < pNtk->vPos->nSize; i_01 = i_01 + 1) {
    pAVar5 = Abc_NtkPo(pNtk,i_01);
    pvVar2 = pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
    pAVar5 = (Abc_Obj_t *)((ulong)(*(uint *)&pAVar5->field_0x14 >> 10 & 1) ^ (ulong)pvVar2);
    if (((ulong)pAVar5 ^ (ulong)pAVar3) == 1) {
      uVar9 = uVar9 + 1;
    }
    else if (((pAVar3 == pAVar5) ||
             (uVar1 = *(uint *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x14), (uVar1 & 0xf) == 2))
            || ((((uint)pAVar5 ^ uVar1 >> 7) & 1) != 0)) {
      local_40 = local_40 + 1;
      if (i_00 == 0xffffffff) {
        i_00 = i_01;
      }
    }
    else {
      local_3c = local_3c + 1;
    }
  }
  printf("Miter:  I =%6d",(ulong)uVar8);
  printf("  N =%7d",(ulong)(uint)pNtk->nObjCounts[7]);
  printf("  ? =%7d",(ulong)local_3c);
  printf("  U =%6d",(ulong)uVar9);
  printf("  S =%6d",(ulong)local_40);
  aVar6 = Abc_Clock();
  printf(" %7.2f sec\n",(double)((float)(aVar6 - aVar4) / 1e+06));
  if (-1 < (int)i_00) {
    pAVar3 = Abc_NtkPo(pNtk,i_00);
    pcVar7 = Abc_ObjName(pAVar3);
    printf("The first satisfiable output is number %d (%s).\n",(ulong)i_00,pcVar7);
    return;
  }
  return;
}

Assistant:

void Abc_NtkPrintMiter( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pChild, * pConst1 = Abc_AigConst1(pNtk);
    int i, iOut = -1;
    abctime Time = Abc_Clock();
    int nUnsat = 0;
    int nSat   = 0;
    int nUndec = 0;
    int nPis   = 0;
    Abc_NtkForEachPi( pNtk, pObj, i )
        nPis += (int)( Abc_ObjFanoutNum(pObj) > 0 );
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        pChild = Abc_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Abc_ObjNot(pConst1) )
            nUnsat++;
        // check if the output is constant 1
        else if ( pChild == pConst1 )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
        // check if the output is a primary input
        else if ( Abc_ObjIsPi(Abc_ObjRegular(pChild)) )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
    // check if the output is 1 for the 0000 pattern
        else if ( Abc_ObjRegular(pChild)->fPhase != (unsigned)Abc_ObjIsComplement(pChild) )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
        else
            nUndec++;
    }
    printf( "Miter:  I =%6d", nPis );
    printf( "  N =%7d", Abc_NtkNodeNum(pNtk) );
    printf( "  ? =%7d", nUndec );
    printf( "  U =%6d", nUnsat );
    printf( "  S =%6d", nSat );
    Time = Abc_Clock() - Time;
    printf(" %7.2f sec\n", (float)(Time)/(float)(CLOCKS_PER_SEC));
    if ( iOut >= 0 )
        printf( "The first satisfiable output is number %d (%s).\n", iOut, Abc_ObjName( Abc_NtkPo(pNtk, iOut) ) );
}